

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

TreeOrError *
slang::syntax::SyntaxTree::fromFiles
          (span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
           paths)

{
  TreeOrError *in_RDI;
  Bag *in_stack_00000160;
  SourceManager *in_stack_00000168;
  undefined1 in_stack_00000170 [16];
  
  getDefaultSourceManager();
  Bag::Bag((Bag *)0x3c5f2a);
  fromFiles((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
             )in_stack_00000170,in_stack_00000168,in_stack_00000160);
  Bag::~Bag((Bag *)0x3c5f54);
  return in_RDI;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFiles(std::span<const std::string_view> paths) {
    return fromFiles(paths, getDefaultSourceManager());
}